

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPseudocost.h
# Opt level: O2

double __thiscall
HighsPseudocost::getPseudocostUp(HighsPseudocost *this,HighsInt col,double frac,double offset)

{
  int iVar1;
  double dVar2;
  double local_18;
  
  iVar1 = (this->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if (iVar1 == 0) {
    dVar2 = 0.0;
  }
  else {
    if (this->minreliable <= iVar1) {
      local_18 = (this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
      goto LAB_002b93b6;
    }
    dVar2 = ((double)iVar1 * 0.1) / (double)this->minreliable + 0.9;
  }
  local_18 = (1.0 - dVar2) * this->cost_total +
             (this->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col] * dVar2;
LAB_002b93b6:
  dVar2 = ceil(frac);
  return (dVar2 - frac) * (local_18 + offset);
}

Assistant:

double getPseudocostUp(HighsInt col, double frac, double offset) const {
    double up = std::ceil(frac) - frac;
    double cost;

    if (nsamplesup[col] == 0 || nsamplesup[col] < minreliable) {
      double weightPs =
          nsamplesup[col] == 0
              ? 0
              : 0.9 + 0.1 * nsamplesup[col] / static_cast<double>(minreliable);
      cost = weightPs * pseudocostup[col];
      cost += (1.0 - weightPs) * getAvgPseudocost();
    } else
      cost = pseudocostup[col];
    return up * (offset + cost);
  }